

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O0

void MapContainerScopeFunctions<ByteCodeGenerator::DefineUncachedFunctions(FuncInfo*)::__0>
               (ParseNode *pnodeScope,anon_class_16_2_0723c1d7 fn)

{
  ParseNodeFnc *this;
  anon_class_8_1_3fcf6586 mapFncDeclsInScopeList;
  ParseNode *pnodeScope_local;
  anon_class_16_2_0723c1d7 fn_local;
  
  fn_local.this = (ByteCodeGenerator *)fn.funcInfoParent;
  pnodeScope_local = (ParseNode *)fn.this;
  this = ParseNode::AsParseNodeFnc(pnodeScope);
  ParseNodeFnc::
  MapContainerScopes<MapContainerScopeFunctions<ByteCodeGenerator::DefineUncachedFunctions(FuncInfo*)::__0>(ParseNode*,ByteCodeGenerator::DefineUncachedFunctions(FuncInfo*)::__0)::_lambda(ParseNode*)_1_>
            (this,(anon_class_16_2_0723c1d7 *)&pnodeScope_local);
  return;
}

Assistant:

void MapContainerScopeFunctions(ParseNode* pnodeScope, Fn fn)
{
    auto mapFncDeclsInScopeList = [&](ParseNode *pnodeHead)
    {
        for (ParseNode *pnode = pnodeHead; pnode != nullptr;)
        {
            switch (pnode->nop)
            {
            case knopFncDecl:
                fn(pnode);
                pnode = pnode->AsParseNodeFnc()->pnodeNext;
                break;

            case knopBlock:
                pnode = pnode->AsParseNodeBlock()->pnodeNext;
                break;

            case knopCatch:
                pnode = pnode->AsParseNodeCatch()->pnodeNext;
                break;

            case knopWith:
                pnode = pnode->AsParseNodeWith()->pnodeNext;
                break;

            default:
                AssertMsg(false, "Unexpected opcode in tree of scopes");
                return;
            }
        }
    };
    pnodeScope->AsParseNodeFnc()->MapContainerScopes(mapFncDeclsInScopeList);
}